

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rmlLinkedList.c
# Opt level: O3

void * rmlLinkedListRemoveItem(void *self,void *item)

{
  void *pvVar1;
  long lVar2;
  long lVar3;
  
  if (item == (void *)0x0) {
    return (void *)0x0;
  }
  lVar2 = *(long *)((long)item + 8);
  lVar3 = *(long *)((long)item + 0x10);
  if (lVar2 == 0) {
    if (lVar3 != 0) goto LAB_00101460;
    if ((*self != item) && (*(void **)((long)self + 8) != item)) {
      return (void *)0x0;
    }
LAB_00101486:
    lVar2 = 0;
  }
  else {
    if (lVar3 == 0) {
      lVar3 = 0;
    }
    else {
LAB_00101460:
      *(long *)(lVar3 + 8) = lVar2;
      lVar2 = *(long *)((long)item + 8);
      if (lVar2 == 0) goto LAB_00101486;
    }
    *(long *)(lVar2 + 0x10) = lVar3;
  }
  if (*self == item) {
    *(undefined8 *)self = *(undefined8 *)((long)item + 0x10);
  }
  if (*(void **)((long)self + 8) == item) {
    *(long *)((long)self + 8) = lVar2;
  }
  *(long *)((long)self + 0x10) = *(long *)((long)self + 0x10) + -1;
  pvVar1 = *item;
  free(item);
  return pvVar1;
}

Assistant:

void *rmlLinkedListRemoveItem(void *self, void *item) {
    if (item == NULL) {
        return NULL;
    }

    struct rmlLinkedList *theList = self;
    struct rmlLinkedListItem *theItem = item;
    if (theItem->pre_ == NULL && theItem->next_ == NULL && theItem != theList->head_ && theItem != theList->tail_) {
        return NULL;
    }

    if (theItem->next_ != NULL) {
        theItem->next_->pre_ = theItem->pre_;
    }
    if (theItem->pre_ != NULL) {
        theItem->pre_->next_ = theItem->next_;
    }
    if (item == theList->head_) {
        theList->head_ = theItem->next_;
    }
    if (item == theList->tail_) {
        theList->tail_ = theItem->pre_;
    }
    theList->length_--;

    void *value = theItem->value_;
    rmlLinkedListItemDestroy(item);
    return value;
}